

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O0

void req0_send_cb(void *arg)

{
  nng_err nVar1;
  int iVar2;
  nni_msg *m;
  nni_aio_completions local_28;
  nni_aio_completions sent_list;
  req0_sock *s;
  req0_pipe *p;
  void *arg_local;
  
  sent_list = *(nni_aio_completions *)((long)arg + 8);
  s = (req0_sock *)arg;
  p = (req0_pipe *)arg;
  nni_aio_completions_init(&local_28);
  nVar1 = nni_aio_result((nni_aio *)&(s->master).pipe_node.ln_prev);
  if (nVar1 == NNG_OK) {
    nni_mtx_lock((nni_mtx *)((long)sent_list + 0x358));
    if ((((ulong)(s->master).pipe_node.ln_next & 1) == 0) &&
       ((*(byte *)((long)sent_list + 4) & 1) == 0)) {
      nni_list_remove((nni_list *)((long)sent_list + 0xb8),s);
      nni_list_append((nni_list *)((long)sent_list + 0xa0),s);
      iVar2 = nni_list_empty((nni_list *)((long)sent_list + 0x100));
      if (iVar2 != 0) {
        nni_pollable_raise((nni_pollable *)((long)sent_list + 0x340));
      }
      req0_run_send_queue((req0_sock *)sent_list,&local_28);
      nni_mtx_unlock((nni_mtx *)((long)sent_list + 0x358));
      nni_aio_completions_run(&local_28);
    }
    else {
      nni_mtx_unlock((nni_mtx *)((long)sent_list + 0x358));
    }
  }
  else {
    m = nni_aio_get_msg((nni_aio *)&(s->master).pipe_node.ln_prev);
    nni_msg_free(m);
    nni_aio_set_msg((nni_aio *)&(s->master).pipe_node.ln_prev,(nni_msg *)0x0);
    nni_pipe_close(*(nni_pipe **)s);
  }
  return;
}

Assistant:

static void
req0_send_cb(void *arg)
{
	req0_pipe          *p = arg;
	req0_sock          *s = p->req;
	nni_aio_completions sent_list;

	nni_aio_completions_init(&sent_list);
	if (nni_aio_result(&p->aio_send) != 0) {
		// We failed to send... clean up and deal with it.
		nni_msg_free(nni_aio_get_msg(&p->aio_send));
		nni_aio_set_msg(&p->aio_send, NULL);
		nni_pipe_close(p->pipe);
		return;
	}

	// We completed a cooked send, so we need to reinsert ourselves
	// in the ready list, and re-run the send_queue.

	nni_mtx_lock(&s->mtx);
	if (p->closed || s->closed) {
		// This occurs if the req0_pipe_close has been called.
		// In that case we don't want any more processing.
		nni_mtx_unlock(&s->mtx);
		return;
	}
	nni_list_remove(&s->busy_pipes, p);
	nni_list_append(&s->ready_pipes, p);
	if (nni_list_empty(&s->send_queue)) {
		nni_pollable_raise(&s->writable);
	}
	req0_run_send_queue(s, &sent_list);
	nni_mtx_unlock(&s->mtx);

	nni_aio_completions_run(&sent_list);
}